

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Stress::anon_unknown_0::UniformCase::iterate(UniformCase *this)

{
  ChannelOrder CVar1;
  RenderContext *context;
  short sVar2;
  RenderCase *this_00;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 err;
  void *__s;
  void *__s_00;
  undefined8 *puVar7;
  short *psVar8;
  undefined4 extraout_var;
  short sVar9;
  long lVar10;
  int x;
  undefined8 *puVar11;
  char *description;
  long lVar12;
  int y;
  qpTestResult testResult;
  long lVar13;
  short *psVar14;
  short sVar15;
  short sVar16;
  void *pvVar17;
  float posX;
  float fVar18;
  float fVar19;
  Surface resultImage;
  UVec4 uniformValue;
  Surface local_1e8;
  RenderCase *local_1d0;
  void *local_1c8;
  long local_1c0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  __s = operator_new(0x2110);
  memset(__s,0,0x2110);
  __s_00 = operator_new(0x16b0);
  memset(__s_00,0,0x16b0);
  tcu::Surface::Surface(&local_1e8,0x100,0x100);
  puVar7 = (undefined8 *)((long)__s + 8);
  lVar10 = 0;
  do {
    fVar18 = (float)(int)lVar10 / 22.0;
    lVar13 = 0;
    puVar11 = puVar7;
    do {
      fVar19 = (float)(int)lVar13 / 22.0;
      *(float *)(puVar11 + -1) = fVar18 + fVar18 + -1.0;
      *(float *)((long)puVar11 + -4) = fVar19 + fVar19 + -1.0;
      *puVar11 = 0x3f80000000000000;
      lVar13 = lVar13 + 1;
      puVar11 = puVar11 + 2;
    } while (lVar13 != 0x17);
    lVar10 = lVar10 + 1;
    puVar7 = puVar7 + 0x2e;
  } while (lVar10 != 0x17);
  psVar8 = (short *)((long)__s_00 + 10);
  sVar9 = 0;
  lVar10 = 0;
  do {
    lVar13 = -0x16;
    psVar14 = psVar8;
    do {
      sVar2 = (short)lVar13;
      sVar15 = sVar9 + sVar2 + 0x16;
      psVar14[-5] = sVar15;
      sVar16 = sVar9 + 0x2e + sVar2;
      psVar14[-4] = sVar16;
      psVar14[-3] = sVar9 + 0x2d + sVar2;
      psVar14[-2] = sVar15;
      psVar14[-1] = sVar16;
      *psVar14 = sVar9 + sVar2 + 0x17;
      psVar14 = psVar14 + 6;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0);
    lVar10 = lVar10 + 1;
    sVar9 = sVar9 + 0x17;
    psVar8 = psVar8 + 0x84;
  } while (lVar10 != 0x16);
  local_1b0 = (undefined1  [8])
              ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,
             "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)."
             ,99);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar4 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar10 = CONCAT44(extraout_var,iVar4);
  uVar5 = (**(code **)(lVar10 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar6 = (**(code **)(lVar10 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_special");
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar10 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar10 + 0x19f0))(uVar5,4,0x1406,0,0,__s);
  (**(code **)(lVar10 + 0x610))(uVar5);
  lVar13 = 0;
  pvVar17 = __s_00;
  local_1d0 = &this->super_RenderCase;
  do {
    CVar1 = (&Stress::(anonymous_namespace)::s_specialFloats)[lVar13];
    lVar12 = 0;
    local_1c8 = pvVar17;
    local_1c0 = lVar13;
    do {
      local_1b0._4_4_ =
           *(ChannelType *)((long)&Stress::(anonymous_namespace)::s_specialFloats + lVar12);
      local_1b0._0_4_ = CVar1;
      local_1a8 = (_func_int **)0x3f8000003f800000;
      (**(code **)(lVar10 + 0x15a8))(uVar6,1,local_1b0);
      (**(code **)(lVar10 + 0x568))(4,6,0x1403,pvVar17);
      pvVar17 = (void *)((long)pvVar17 + 0xc);
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x58);
    lVar13 = local_1c0 + 1;
    pvVar17 = (void *)((long)local_1c8 + 0x108);
  } while (lVar13 != 0x16);
  (**(code **)(lVar10 + 0x518))(uVar5);
  this_00 = local_1d0;
  (**(code **)(lVar10 + 0x1680))(0);
  (**(code **)(lVar10 + 0x648))();
  err = (**(code **)(lVar10 + 0x800))();
  glu::checkError(err,"UniformCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x376);
  context = ((this_00->super_TestCase).m_context)->m_renderCtx;
  local_1b8.order = RGBA;
  local_1b8.type = UNORM_INT8;
  if ((void *)local_1e8.m_pixels.m_cap != (void *)0x0) {
    local_1e8.m_pixels.m_cap = (size_t)local_1e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1b8,local_1e8.m_width,local_1e8.m_height,1,
             (void *)local_1e8.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar3 = RenderCase::checkResultImage(this_00,&local_1e8);
  if (bVar3) {
    bVar3 = RenderCase::drawTestPattern(this_00,false);
    testResult = (qpTestResult)!bVar3;
    description = "test pattern failed";
    if (bVar3) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this_00->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  tcu::Surface::~Surface(&local_1e8);
  operator_delete(__s_00,0x16b0);
  operator_delete(__s,0x2110);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of tile with each tile having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]
		const float		posY	= (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f;

		gridVertices[x * (DE_LENGTH_OF_ARRAY(s_specialFloats)+1) + y] = tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats)) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
		for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
		{
			const deUint32		one				= 0x3F800000;
			const tcu::UVec4	uniformValue	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
			const int			indexIndex		= (x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y) * 6;

			gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
			gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
		}

		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}